

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_REG_RPTR(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,x86Size size,x86Reg index
                     ,int multiplier,x86Reg base,uint shift)

{
  x86Argument arg;
  bool bVar1;
  uint uVar2;
  x86Reg xVar3;
  x86Reg local_50;
  uint i;
  uint memIndex;
  x86Argument address;
  x86Reg local_20;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  x86Reg reg1_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  address.ptrNum = multiplier;
  local_20 = index;
  multiplier_local = size;
  index_local = reg1;
  size_local = op;
  _reg1_local = ctx;
  if ((ctx->skipTracking & 1U) == 0) {
    CodeGenGenericContext::RedirectAddressComputation(ctx,&local_20,&address.ptrNum,&base,&shift);
    CodeGenGenericContext::ReadRegister(_reg1_local,base);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_20);
  }
  x86Argument::x86Argument((x86Argument *)&i,multiplier_local,local_20,address.ptrNum,base,shift);
  switch(size_local) {
  case sBYTE:
  case 0x4d:
    if ((_reg1_local->skipTracking & 1U) == 0) {
      uVar2 = CodeGenGenericContext::MemFind(_reg1_local,(x86Argument *)&i);
      if (uVar2 != 0) {
        uVar2 = uVar2 - 1;
        if (_reg1_local->memCache[uVar2].value.type == argReg) {
          xVar3 = rEDX;
          if (size_local == sBYTE) {
            xVar3 = rECX;
          }
          if (_reg1_local->memCache[uVar2].address.field_1.reg == xVar3) {
            EMIT_OP_REG_REG(_reg1_local,size_local,index_local,
                            _reg1_local->memCache[uVar2].value.field_1.reg);
            return;
          }
          __assert_fail("ctx.memCache[memIndex].address.ptrSize == (op == o_mov ? sDWORD : sQWORD)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x5dc,
                        "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86Reg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                       );
        }
        if (_reg1_local->memCache[uVar2].value.type == argNumber) {
          EMIT_OP_REG_NUM(_reg1_local,size_local,index_local,
                          _reg1_local->memCache[uVar2].value.field_1.labelID);
          return;
        }
      }
      for (local_50 = rNONE; local_50 < rRegCount; local_50 = local_50 + rEAX) {
        if ((_reg1_local->genReg[local_50].type == argPtr) &&
           (bVar1 = x86Argument::operator==(_reg1_local->genReg + local_50,(x86Argument *)&i), bVar1
           )) {
          EMIT_OP_REG_REG(_reg1_local,size_local,index_local,local_50);
          return;
        }
      }
      CodeGenGenericContext::MemRead(_reg1_local,(x86Argument *)&i);
      if ((index_local == base) || (index_local == local_20)) {
        CodeGenGenericContext::OverwriteRegisterWithUnknown(_reg1_local,index_local);
      }
      else {
        arg.field_1 = (anon_union_8_6_73be8994_for_x86Argument_2)address._0_8_;
        arg.type = i;
        arg._4_4_ = memIndex;
        arg.ptrBase = address.field_1._0_4_;
        arg.ptrIndex = address.field_1._4_4_;
        arg.ptrMult = address.ptrBase;
        arg.ptrNum = address.ptrIndex;
        CodeGenGenericContext::OverwriteRegisterWithValue(_reg1_local,index_local,arg);
      }
    }
    break;
  case sWORD:
  case 0x37:
    CodeGenGenericContext::MemRead(_reg1_local,(x86Argument *)&i);
    CodeGenGenericContext::OverwriteRegisterWithUnknown(_reg1_local,index_local);
    break;
  default:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x622,
                  "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86Reg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                 );
  case sQWORD|sBYTE:
    if ((local_20 == rNONE) && (shift == 0)) {
      EMIT_OP_REG_REG(_reg1_local,o_mov64,index_local,base);
      return;
    }
    CodeGenGenericContext::OverwriteRegisterWithUnknown(_reg1_local,index_local);
    break;
  case 0x1d:
  case 0x1f:
  case 0x21:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x3a:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x5a:
    CodeGenGenericContext::MemRead(_reg1_local,(x86Argument *)&i);
    CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,index_local);
    break;
  case 0x2a:
  case 0x59:
    CodeGenGenericContext::MemRead(_reg1_local,(x86Argument *)&i);
    CodeGenGenericContext::ReadRegister(_reg1_local,index_local);
  }
  _reg1_local->x86Op->name = size_local;
  (_reg1_local->x86Op->argA).type = argReg;
  (_reg1_local->x86Op->argA).field_1.reg = index_local;
  (_reg1_local->x86Op->argB).type = argPtr;
  (_reg1_local->x86Op->argB).field_1.num = multiplier_local;
  (_reg1_local->x86Op->argB).ptrIndex = local_20;
  (_reg1_local->x86Op->argB).ptrMult = address.ptrNum;
  (_reg1_local->x86Op->argB).ptrBase = base;
  (_reg1_local->x86Op->argB).ptrNum = shift;
  _reg1_local->x86Op = _reg1_local->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_RPTR(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift)
{
#ifdef NULLC_OPTIMIZE_X86
	if(!ctx.skipTracking)
	{
		ctx.RedirectAddressComputation(index, multiplier, base, shift);

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);
	}

	x86Argument address = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_mov:
	case o_mov64:
		if(ctx.skipTracking)
			break;

		if(unsigned memIndex = ctx.MemFind(address))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argReg)
			{
				assert(ctx.memCache[memIndex].address.ptrSize == (op == o_mov ? sDWORD : sQWORD));

				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.reg);
				return;
			}
			else if(ctx.memCache[memIndex].value.type == x86Argument::argNumber)
			{
				EMIT_OP_REG_NUM(ctx, op, reg1, ctx.memCache[memIndex].value.num);
				return;
			}
		}

		// If another register contains data from memory
		for(unsigned i = 0; i < rRegCount; i++)
		{
			if(ctx.genReg[i].type == x86Argument::argPtr && ctx.genReg[i] == address)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, (x86Reg)i);
				return;
			}
		}

		ctx.MemRead(address);

		// If write doesn't invalidate the source registers, mark that register contains value from source address
		if(reg1 != base && reg1 != index)
			ctx.OverwriteRegisterWithValue(reg1, address);
		else
			ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_movsx:
	case o_movsxd:
		ctx.MemRead(address);

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_lea:
		if(index == rNONE && shift == 0)
		{
			EMIT_OP_REG_REG(ctx, sizeof(void*) == 8 ? o_mov64 : o_mov, reg1, base);
			return;
		}

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_cvttsd2si:
	case o_cvttsd2si64:
	case o_add:
	case o_sub:
	case o_imul:
	case o_and:
	case o_or:
	case o_xor:
	case o_add64:
	case o_sub64:
	case o_imul64:
	case o_and64:
	case o_or64:
	case o_xor64:
		ctx.MemRead(address);

		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_cmp:
	case o_cmp64:
		ctx.MemRead(address);

		ctx.ReadRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argPtr;
	ctx.x86Op->argB.ptrSize = size;
	ctx.x86Op->argB.ptrIndex = index;
	ctx.x86Op->argB.ptrMult = multiplier;
	ctx.x86Op->argB.ptrBase = base;
	ctx.x86Op->argB.ptrNum = shift;
	ctx.x86Op++;
}